

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall r_comp::Decompiler::write_cmd(Decompiler *this,uint16_t read_index)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  if (this->in_hlp == false) {
    this->horizontal_set = true;
  }
  uStack_18 = in_RAX;
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  uStack_18 = CONCAT17(0x28,(undefined7)uStack_18);
  OutStream::push<char>(this->out_stream,(char *)((long)&uStack_18 + 7),read_index);
  write_expression_head(this,read_index);
  write_expression_tail(this,read_index,false,false);
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  uStack_18._0_7_ = CONCAT16(0x29,(undefined6)uStack_18);
  OutStream::operator<<(this->out_stream,(char *)((long)&uStack_18 + 6));
  if (this->in_hlp == false) {
    this->horizontal_set = false;
  }
  return;
}

Assistant:

void Decompiler::write_cmd(uint16_t read_index)
{
    if (!in_hlp) {
        horizontal_set = true;
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    write_expression_tail(read_index, false);

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';

    if (!in_hlp) {
        horizontal_set = false;
    }
}